

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDemo.c
# Opt level: O0

void RDL_demo_output(RDL_data *URFdata)

{
  uint uVar1;
  uint uVar2;
  long local_48;
  char **otherCycleArray;
  RDL_cycle **cycleArray;
  RDL_node *atoms;
  RDL_edge *bondArray;
  uint local_20;
  uint edgeCount;
  uint obIdx;
  uint count;
  uint idx;
  uint URFcount;
  RDL_data *URFdata_local;
  
  _idx = URFdata;
  count = RDL_getNofURF(URFdata);
  printf("==========================================================URF=\n");
  printf("Number of Unique Ring Families: %d\n\n",(ulong)count);
  for (obIdx = 0; uVar1 = obIdx, obIdx < count; obIdx = obIdx + 1) {
    uVar2 = RDL_getWeightForURF(_idx,obIdx);
    printf("URF %d has weight %d.\n",(ulong)uVar1,(ulong)uVar2);
  }
  printf("\n===============================================================\n");
  printf("The rest of this output might depend on the order of the input:\n\n");
  for (obIdx = 0; obIdx < count; obIdx = obIdx + 1) {
    edgeCount = RDL_getEdgesForURF(_idx,obIdx,&atoms);
    printf("There are %d bonds in URF %d.\n",(ulong)edgeCount,(ulong)obIdx);
    free(atoms);
  }
  printf("\n");
  for (obIdx = 0; obIdx < count; obIdx = obIdx + 1) {
    printf("Atoms in URF %d: ",(ulong)obIdx);
    edgeCount = RDL_getNodesForURF(_idx,obIdx,&cycleArray);
    for (local_20 = 0; local_20 < edgeCount; local_20 = local_20 + 1) {
      printf("%d ",(ulong)*(uint *)((long)cycleArray + (ulong)local_20 * 4));
    }
    printf("\n");
    free(cycleArray);
  }
  printf("\n");
  printf("A possible MCB (SSSR) ");
  edgeCount = RDL_getSSSR(_idx,&otherCycleArray);
  printf("(%d rings):\n",(ulong)edgeCount);
  for (obIdx = 0; obIdx < edgeCount; obIdx = obIdx + 1) {
    printf("ring %d: ",(ulong)obIdx);
    local_20 = 0;
    while( true ) {
      if (*(uint *)(otherCycleArray[obIdx] + 8) <= local_20) break;
      printf("(%d ",(ulong)*(uint *)(*(long *)otherCycleArray[obIdx] + (ulong)local_20 * 8));
      printf("%d), ",(ulong)*(uint *)(*(long *)otherCycleArray[obIdx] + 4 + (ulong)local_20 * 8));
      local_20 = local_20 + 1;
    }
    printf("\n");
  }
  RDL_deleteCycles(otherCycleArray,edgeCount);
  printf("\n");
  printf("The RC Prototypes with bonds as pairs of atoms ");
  edgeCount = RDL_getRCPrototypes(_idx,&otherCycleArray);
  printf("(%d rings):\n",(ulong)edgeCount);
  for (obIdx = 0; obIdx < edgeCount; obIdx = obIdx + 1) {
    printf("ring %d: ",(ulong)obIdx);
    local_20 = 0;
    while( true ) {
      if (*(uint *)(otherCycleArray[obIdx] + 8) <= local_20) break;
      printf("(%d ",(ulong)*(uint *)(*(long *)otherCycleArray[obIdx] + (ulong)local_20 * 8));
      printf("%d), ",(ulong)*(uint *)(*(long *)otherCycleArray[obIdx] + 4 + (ulong)local_20 * 8));
      local_20 = local_20 + 1;
    }
    printf("\n");
  }
  printf("\n");
  printf("The RC Prototypes as vectors ");
  edgeCount = RDL_translateCycArray(_idx,otherCycleArray,edgeCount,&local_48);
  printf("(%d rings):\n",(ulong)edgeCount);
  bondArray._4_4_ = RDL_getEdgeArray(_idx,&atoms);
  printf("Edge from");
  for (obIdx = 0; obIdx < bondArray._4_4_; obIdx = obIdx + 1) {
    printf("%2d",(ulong)atoms[(ulong)obIdx * 2]);
  }
  printf("\n     to  ");
  for (obIdx = 0; obIdx < bondArray._4_4_; obIdx = obIdx + 1) {
    printf("%2d",(ulong)atoms[(ulong)obIdx * 2 + 1]);
  }
  printf("\n");
  free(atoms);
  for (obIdx = 0; obIdx < edgeCount; obIdx = obIdx + 1) {
    printf("ring %3d: ",(ulong)obIdx);
    for (local_20 = 0; local_20 < bondArray._4_4_; local_20 = local_20 + 1) {
      printf("%d ",(ulong)(uint)(int)*(char *)(*(long *)(local_48 + (ulong)obIdx * 8) +
                                              (ulong)local_20));
    }
    printf("\n");
  }
  RDL_deleteCycles(otherCycleArray,edgeCount);
  RDL_deleteEdgeIdxArray(local_48,edgeCount);
  printf("==========================================================URF=\n");
  return;
}

Assistant:

void RDL_demo_output(RDL_data* URFdata)
{
  unsigned URFcount, idx, count, obIdx, edgeCount;
  RDL_edge *bondArray;
  RDL_node *atoms;
  RDL_cycle **cycleArray;
  char **otherCycleArray;

  /* some output */
  URFcount = RDL_getNofURF(URFdata);
  printf("==========================================================URF=\n");
  printf("Number of Unique Ring Families: %d\n\n", URFcount);
  for(idx=0; idx<URFcount; ++idx)
  {
    printf("URF %d has weight %d.\n", idx, RDL_getWeightForURF(URFdata, idx));
  }
  /* some more output which might change when the order of the input is changed*/
  printf("\n===============================================================\n");
  printf("The rest of this output might depend on the order of the input:\n\n");
  for(idx=0; idx<URFcount; ++idx)
  {
      count = RDL_getEdgesForURF(URFdata, idx, &bondArray);
      printf("There are %d bonds in URF %d.\n", count, idx);
      free(bondArray);
  }
  printf("\n");

  for(idx=0; idx<URFcount; ++idx)
  {
      printf("Atoms in URF %d: ",idx);
      count = RDL_getNodesForURF(URFdata, idx, &atoms);
      for(obIdx=0; obIdx<count; ++obIdx)
      {
          printf("%d ",atoms[obIdx]);
      }
      printf("\n");
      free(atoms);
  }
  printf("\n");

  printf("A possible MCB (SSSR) ");
  count = RDL_getSSSR(URFdata, &cycleArray);
  printf("(%d rings):\n",count);
  for(idx=0; idx<count; ++idx)
  {
      printf("ring %d: ",idx);
      for(obIdx=0; obIdx<cycleArray[idx]->weight;  ++obIdx)
      {
          printf("(%d ",cycleArray[idx]->edges[obIdx][0]);
          printf("%d), ",cycleArray[idx]->edges[obIdx][1]);
      }
      printf("\n");
  }
  RDL_deleteCycles(cycleArray, count);
  printf("\n");

  printf("The RC Prototypes with bonds as pairs of atoms ");
  count = RDL_getRCPrototypes(URFdata, &cycleArray);
  printf("(%d rings):\n",count);
  for(idx=0; idx<count; ++idx)
  {
      printf("ring %d: ",idx);
      for(obIdx=0; obIdx<cycleArray[idx]->weight; ++obIdx)
      {
          printf("(%d ",cycleArray[idx]->edges[obIdx][0]);
          printf("%d), ",cycleArray[idx]->edges[obIdx][1]);
      }
      printf("\n");
  }
  printf("\n");

  printf("The RC Prototypes as vectors ");
  count = RDL_translateCycArray(URFdata, cycleArray, count, &otherCycleArray);
  printf("(%d rings):\n",count);
  /* To be able to understand the bitsets better: */
  edgeCount = RDL_getEdgeArray(URFdata, &bondArray);
  printf("Edge from");
  for(idx=0; idx<edgeCount; ++idx)
  {
      printf("%2d",bondArray[idx][0]);
  }
  printf("\n     to  ");
  for(idx=0; idx<edgeCount; ++idx)
  {
      printf("%2d",bondArray[idx][1]);
  }
  printf("\n");
  free(bondArray);
  /* the bitsets: */
  for(idx=0; idx<count; ++idx)
  {
      printf("ring %3d: ",idx);
      for(obIdx=0; obIdx<edgeCount; ++obIdx)
      {
          printf("%d ",otherCycleArray[idx][obIdx]);
      }
      printf("\n");
  }
  RDL_deleteCycles(cycleArray, count);
  RDL_deleteEdgeIdxArray(otherCycleArray, count);
  printf("==========================================================URF=\n");
}